

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O0

void __thiscall
Lowerer::LowerBailOnCreatedMissingValue(Lowerer *this,Instr *instr,bool isInHelperBlock)

{
  Func *func_00;
  code *pcVar1;
  undefined8 compareSrc1;
  bool bVar2;
  IRType type;
  undefined4 *puVar3;
  Opnd *pOVar4;
  IndirOpnd *this_00;
  Instr *pIVar5;
  LabelInstr *target;
  Instr *this_01;
  IntConstOpnd *compareSrc2;
  undefined1 local_b0 [8];
  AutoReuseOpnd autoReuseCreatedFirstMissingValueOpnd;
  RegOpnd *createdFirstMissingValueOpnd;
  Instr *callInstr;
  Instr *insertBeforeInstr;
  LabelInstr *skipBailOutLabel;
  Instr *callInstr_1;
  undefined1 local_58 [7];
  IRType arrayFlagsType;
  AutoReuseOpnd autoReuseArrayFlagsBeforeHelperCallOpnd;
  Opnd *arrayFlagsBeforeHelperCallOpnd;
  RegOpnd *pRStack_30;
  ValueType baseValueType;
  RegOpnd *baseOpnd;
  Func *func;
  bool isInHelperBlock_local;
  Instr *instr_local;
  Lowerer *this_local;
  
  if (instr == (Instr *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x34eb,"(instr)","instr");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  if ((((instr->m_opcode != StElemI_A) && (instr->m_opcode != StElemI_A_Strict)) &&
      (instr->m_opcode != Memset)) && (instr->m_opcode != Memcopy)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x34ec,
                       "(instr->m_opcode == Js::OpCode::StElemI_A || instr->m_opcode == Js::OpCode::StElemI_A_Strict || instr->m_opcode == Js::OpCode::Memset || instr->m_opcode == Js::OpCode::Memcopy)"
                       ,
                       "instr->m_opcode == Js::OpCode::StElemI_A || instr->m_opcode == Js::OpCode::StElemI_A_Strict || instr->m_opcode == Js::OpCode::Memset || instr->m_opcode == Js::OpCode::Memcopy"
                      );
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  pOVar4 = IR::Instr::GetDst(instr);
  if (pOVar4 == (Opnd *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x34ed,"(instr->GetDst())","instr->GetDst()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  pOVar4 = IR::Instr::GetDst(instr);
  bVar2 = IR::Opnd::IsIndirOpnd(pOVar4);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x34ee,"(instr->GetDst()->IsIndirOpnd())","instr->GetDst()->IsIndirOpnd()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  func_00 = instr->m_func;
  pOVar4 = IR::Instr::GetDst(instr);
  this_00 = IR::Opnd::AsIndirOpnd(pOVar4);
  pRStack_30 = IR::IndirOpnd::GetBaseOpnd(this_00);
  arrayFlagsBeforeHelperCallOpnd._6_2_ =
       (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
       IR::Opnd::GetValueType(&pRStack_30->super_Opnd);
  bVar2 = ValueType::IsNotArrayOrObjectWithArray
                    ((ValueType *)((long)&arrayFlagsBeforeHelperCallOpnd + 6));
  if (bVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x34f4,"(!baseValueType.IsNotArrayOrObjectWithArray())",
                       "!baseValueType.IsNotArrayOrObjectWithArray()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  autoReuseArrayFlagsBeforeHelperCallOpnd.autoDelete = false;
  autoReuseArrayFlagsBeforeHelperCallOpnd.wasInUse = false;
  autoReuseArrayFlagsBeforeHelperCallOpnd._18_6_ = 0;
  IR::AutoReuseOpnd::AutoReuseOpnd((AutoReuseOpnd *)local_58);
  bVar2 = ValueType::IsArrayOrObjectWithArray
                    ((ValueType *)((long)&arrayFlagsBeforeHelperCallOpnd + 6));
  if ((!bVar2) ||
     (bVar2 = ValueType::HasNoMissingValues
                        ((ValueType *)((long)&arrayFlagsBeforeHelperCallOpnd + 6)), !bVar2)) {
    LowererMD::LoadHelperArgument(&this->m_lowererMD,instr,&pRStack_30->super_Opnd);
    pIVar5 = IR::Instr::New(Call,func_00);
    autoReuseArrayFlagsBeforeHelperCallOpnd._16_8_ = IR::RegOpnd::New(TyUint64,func_00);
    IR::AutoReuseOpnd::Initialize
              ((AutoReuseOpnd *)local_58,(Opnd *)autoReuseArrayFlagsBeforeHelperCallOpnd._16_8_,
               func_00,true);
    IR::Instr::SetDst(pIVar5,(Opnd *)autoReuseArrayFlagsBeforeHelperCallOpnd._16_8_);
    IR::Instr::InsertBefore(instr,pIVar5);
    LowererMD::ChangeToHelperCall
              (&this->m_lowererMD,pIVar5,HelperArray_Jit_GetArrayFlagsForArrayOrObjectWithArray,
               (LabelInstr *)0x0,(Opnd *)0x0,(PropertySymOpnd *)0x0,false);
  }
  target = IR::Instr::GetOrCreateContinueLabel(instr,isInHelperBlock);
  LowerOneBailOutKind(this,instr,BailOutOnMissingValue,isInHelperBlock,false);
  pIVar5 = instr->m_next;
  bVar2 = ValueType::IsArrayOrObjectWithArray
                    ((ValueType *)((long)&arrayFlagsBeforeHelperCallOpnd + 6));
  if ((bVar2) &&
     (bVar2 = ValueType::HasNoMissingValues
                        ((ValueType *)((long)&arrayFlagsBeforeHelperCallOpnd + 6)), bVar2)) {
    if (autoReuseArrayFlagsBeforeHelperCallOpnd._16_8_ != 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar3 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                         ,0x3510,"(!arrayFlagsBeforeHelperCallOpnd)",
                         "!arrayFlagsBeforeHelperCallOpnd");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar3 = 0;
    }
    autoReuseArrayFlagsBeforeHelperCallOpnd._16_8_ =
         IR::AddrOpnd::New(&DAT_00000004,AddrOpndKindConstantVar,func_00,true,(Var)0x0);
    IR::AutoReuseOpnd::Initialize
              ((AutoReuseOpnd *)local_58,(Opnd *)autoReuseArrayFlagsBeforeHelperCallOpnd._16_8_,
               func_00,true);
  }
  else if (autoReuseArrayFlagsBeforeHelperCallOpnd._16_8_ == 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x3522,"(arrayFlagsBeforeHelperCallOpnd)","arrayFlagsBeforeHelperCallOpnd");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  LowererMD::LoadHelperArgument(&this->m_lowererMD,pIVar5,&pRStack_30->super_Opnd);
  LowererMD::LoadHelperArgument
            (&this->m_lowererMD,pIVar5,(Opnd *)autoReuseArrayFlagsBeforeHelperCallOpnd._16_8_);
  this_01 = IR::Instr::New(Call,func_00);
  autoReuseCreatedFirstMissingValueOpnd._16_8_ = IR::RegOpnd::New(TyUint8,func_00);
  IR::AutoReuseOpnd::AutoReuseOpnd
            ((AutoReuseOpnd *)local_b0,(Opnd *)autoReuseCreatedFirstMissingValueOpnd._16_8_,func_00,
             true);
  IR::Instr::SetDst(this_01,(Opnd *)autoReuseCreatedFirstMissingValueOpnd._16_8_);
  IR::Instr::InsertBefore(pIVar5,this_01);
  LowererMD::ChangeToHelperCall
            (&this->m_lowererMD,this_01,HelperArray_Jit_OperationCreatedFirstMissingValue,
             (LabelInstr *)0x0,(Opnd *)0x0,(PropertySymOpnd *)0x0,false);
  compareSrc1 = autoReuseCreatedFirstMissingValueOpnd._16_8_;
  type = IR::Opnd::GetType((Opnd *)autoReuseCreatedFirstMissingValueOpnd._16_8_);
  compareSrc2 = IR::IntConstOpnd::New(0,type,func_00,true);
  InsertCompareBranch(this,(Opnd *)compareSrc1,&compareSrc2->super_Opnd,BrEq_A,target,pIVar5,false);
  IR::AutoReuseOpnd::~AutoReuseOpnd((AutoReuseOpnd *)local_b0);
  IR::AutoReuseOpnd::~AutoReuseOpnd((AutoReuseOpnd *)local_58);
  return;
}

Assistant:

void Lowerer::LowerBailOnCreatedMissingValue(IR::Instr *const instr, const bool isInHelperBlock)
{
    /*
        // Generate checks for whether the first missing value was created during the helper call

        if(!(baseValueType.IsArrayOrObjectWithArray() && baseValueType.HasNoMissingValues()))
        {
            // Record whether the array has missing values before the helper call
            arrayFlagsBeforeHelperCall = Js::JavascriptArray::Jit_GetArrayFlagsForArrayOrObjectWithArray(base)
        }

        helperCall:
            (Helper call and other bailout checks)

        // If the array had no missing values before the helper call, and the array has missing values after the helper
        // call, then this store created the first missing value in the array and needs to bail out
        if(baseValueType.IsArrayOrObjectWithArray() && baseValueType.HasNoMissingValues())
            (arrayFlagsBeforeHelperCall = Js::DynamicObjectFlags::HasNoMissingValues)
        createdFirstMissingValue = JavascriptArray::Jit_OperationCreatedFirstMissingValue(arrayFlagsBeforeHelperCall, base)
        test createdFirstMissingValue, createdFirstMissingValue
        jz $skipBailOut

        (Bail out with IR::BailOutOnMissingValue)

        $skipBailOut:
    */

    Assert(instr);
    Assert(instr->m_opcode == Js::OpCode::StElemI_A || instr->m_opcode == Js::OpCode::StElemI_A_Strict || instr->m_opcode == Js::OpCode::Memset || instr->m_opcode == Js::OpCode::Memcopy);
    Assert(instr->GetDst());
    Assert(instr->GetDst()->IsIndirOpnd());

    Func *const func = instr->m_func;

    IR::RegOpnd *const baseOpnd = instr->GetDst()->AsIndirOpnd()->GetBaseOpnd();
    const ValueType baseValueType(baseOpnd->GetValueType());
    Assert(!baseValueType.IsNotArrayOrObjectWithArray());

    IR::Opnd *arrayFlagsBeforeHelperCallOpnd = nullptr;
    IR::AutoReuseOpnd autoReuseArrayFlagsBeforeHelperCallOpnd;
    const IRType arrayFlagsType = sizeof(uintptr_t) == sizeof(uint32) ? TyUint32 : TyUint64;
    if(!(baseValueType.IsArrayOrObjectWithArray() && baseValueType.HasNoMissingValues()))
    {
        // Record whether the array has missing values before the helper call
        //     arrayFlagsBeforeHelperCall = Js::JavascriptArray::Jit_GetArrayFlagsForArrayOrObjectWithArray(base)
        m_lowererMD.LoadHelperArgument(instr, baseOpnd);
        IR::Instr *const callInstr = IR::Instr::New(Js::OpCode::Call, func);
        arrayFlagsBeforeHelperCallOpnd = IR::RegOpnd::New(arrayFlagsType, func);
        autoReuseArrayFlagsBeforeHelperCallOpnd.Initialize(arrayFlagsBeforeHelperCallOpnd, func);
        callInstr->SetDst(arrayFlagsBeforeHelperCallOpnd);
        instr->InsertBefore(callInstr);
        m_lowererMD.ChangeToHelperCall(callInstr, IR::HelperArray_Jit_GetArrayFlagsForArrayOrObjectWithArray);
    }

    IR::LabelInstr *const skipBailOutLabel = instr->GetOrCreateContinueLabel(isInHelperBlock);
    LowerOneBailOutKind(instr, IR::BailOutOnMissingValue, isInHelperBlock);
    IR::Instr *const insertBeforeInstr = instr->m_next;

    // If the array had no missing values before the helper call, and the array has missing values after the helper
    // call, then this store created the first missing value in the array and needs to bail out

    if(baseValueType.IsArrayOrObjectWithArray() && baseValueType.HasNoMissingValues())
    {
        //     (arrayFlagsBeforeHelperCall = Js::DynamicObjectFlags::HasNoMissingValues)
        Assert(!arrayFlagsBeforeHelperCallOpnd);
        arrayFlagsBeforeHelperCallOpnd =
            arrayFlagsType == TyUint32
                ? static_cast<IR::Opnd *>(
                    IR::IntConstOpnd::New(
                        static_cast<uintptr_t>(Js::DynamicObjectFlags::HasNoMissingValues),
                        arrayFlagsType,
                        func,
                        true))
                : IR::AddrOpnd::New(
                    reinterpret_cast<void *>(Js::DynamicObjectFlags::HasNoMissingValues),
                    IR::AddrOpndKindConstantVar,
                    func,
                    true);
        autoReuseArrayFlagsBeforeHelperCallOpnd.Initialize(arrayFlagsBeforeHelperCallOpnd, func);
    }
    else
    {
        Assert(arrayFlagsBeforeHelperCallOpnd);
    }

    //     createdFirstMissingValue = JavascriptArray::Jit_OperationCreatedFirstMissingValue(arrayFlagsBeforeHelperCall, base)
    m_lowererMD.LoadHelperArgument(insertBeforeInstr, baseOpnd);
    m_lowererMD.LoadHelperArgument(insertBeforeInstr, arrayFlagsBeforeHelperCallOpnd);
    IR::Instr *const callInstr = IR::Instr::New(Js::OpCode::Call, func);
    IR::RegOpnd *const createdFirstMissingValueOpnd = IR::RegOpnd::New(TyUint8, func);
    IR::AutoReuseOpnd autoReuseCreatedFirstMissingValueOpnd(createdFirstMissingValueOpnd, func);
    callInstr->SetDst(createdFirstMissingValueOpnd);
    insertBeforeInstr->InsertBefore(callInstr);
    m_lowererMD.ChangeToHelperCall(callInstr, IR::HelperArray_Jit_OperationCreatedFirstMissingValue);

    //     test createdFirstMissingValue, createdFirstMissingValue
    //     jz $skipBailOut
    InsertCompareBranch(
        createdFirstMissingValueOpnd,
        IR::IntConstOpnd::New(0, createdFirstMissingValueOpnd->GetType(), func, true),
        Js::OpCode::BrEq_A,
        skipBailOutLabel,
        insertBeforeInstr);

    //     (Bail out with IR::BailOutOnMissingValue)
    //     $skipBailOut:
}